

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

void __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::computeBoundingBox
          (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
           *this,BoundingBox *bbox)

{
  double *pdVar1;
  undefined8 uVar2;
  vector<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
  *pvVar3;
  pointer pPVar4;
  Vector *pVVar5;
  runtime_error *this_00;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  pvVar3 = this->dataset->m_points;
  pPVar4 = (pvVar3->
           super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(pvVar3->
                super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4;
  if (lVar7 != 0) {
    uVar6 = (lVar7 >> 3) * -0x3333333333333333;
    lVar7 = 0;
    do {
      uVar2 = *(undefined8 *)
               ((long)&(pPVar4->point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage + lVar7);
      *(undefined8 *)((long)&bbox->_M_elems[0].high + lVar7 * 2) = uVar2;
      *(undefined8 *)((long)&bbox->_M_elems[0].low + lVar7 * 2) = uVar2;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x18);
    if (1 < uVar6) {
      pVVar5 = &pPVar4[1].point;
      uVar8 = 1;
      do {
        lVar7 = 0;
        do {
          dVar9 = *(double *)
                   ((long)&(pVVar5->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                           m_storage.m_data + lVar7);
          if (dVar9 < *(double *)((long)&bbox->_M_elems[0].low + lVar7 * 2)) {
            *(double *)((long)&bbox->_M_elems[0].low + lVar7 * 2) = dVar9;
            dVar9 = *(double *)
                     ((long)&(pVVar5->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                             m_storage.m_data + lVar7);
          }
          pdVar1 = (double *)((long)&bbox->_M_elems[0].high + lVar7 * 2);
          if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) {
            *(double *)((long)&bbox->_M_elems[0].high + lVar7 * 2) = dVar9;
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x18);
        uVar8 = uVar8 + 1;
        pVVar5 = (Vector *)((long)(pVVar5 + 1) + 0x10);
      } while (uVar8 != uVar6);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"[nanoflann] computeBoundingBox() called but no data points found.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void computeBoundingBox(BoundingBox &bbox) {
    resize(bbox, (DIM > 0 ? DIM : BaseClassRef::dim));
    if (dataset.kdtree_get_bbox(bbox)) {
      // Done! It was implemented in derived class
    } else {
      const size_t N = dataset.kdtree_get_point_count();
      if (!N)
        throw std::runtime_error("[nanoflann] computeBoundingBox() called but "
                                 "no data points found.");
      for (int i = 0; i < (DIM > 0 ? DIM : BaseClassRef::dim); ++i) {
        bbox[i].low = bbox[i].high = this->dataset_get(*this, 0, i);
      }
      for (size_t k = 1; k < N; ++k) {
        for (int i = 0; i < (DIM > 0 ? DIM : BaseClassRef::dim); ++i) {
          if (this->dataset_get(*this, k, i) < bbox[i].low)
            bbox[i].low = this->dataset_get(*this, k, i);
          if (this->dataset_get(*this, k, i) > bbox[i].high)
            bbox[i].high = this->dataset_get(*this, k, i);
        }
      }
    }
  }